

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O0

int vkt::pipeline::anon_unknown_0::SamplerTest::getArraySize(VkImageViewType viewType)

{
  undefined4 local_c;
  VkImageViewType viewType_local;
  
  if (viewType - VK_IMAGE_VIEW_TYPE_CUBE < 3) {
    local_c = 6;
  }
  else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) {
    local_c = 0x24;
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

int SamplerTest::getArraySize (VkImageViewType viewType)
{
	switch (viewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_CUBE:
			return 6;

		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			return 36;

		default:
			break;
	}

	return 1;
}